

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O3

void __thiscall HDualRow::choose_final(HDualRow *this)

{
  int *__args;
  double dVar1;
  int iVar2;
  pointer ppVar3;
  int *piVar4;
  double *pdVar5;
  HModel *pHVar6;
  pointer piVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  uint uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  long lVar18;
  iterator iVar19;
  uint uVar20;
  int iVar21;
  pointer ppVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  double *pdVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int local_4c;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  uVar10 = rdtsc();
  uVar16 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar11._4_4_ = uVar16;
  auVar11._0_4_ = uVar16;
  auVar11._8_4_ = 0;
  auVar28._0_12_ = auVar11 << 0x20;
  auVar28._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xd] =
       (auVar28._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  iVar24 = this->workCount;
  this->workCount = 0;
  local_38 = ABS(this->workDelta);
  __args = &this->workCount;
  dVar27 = this->workTheta * 10.0 + 1e-07;
  ppVar3 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar4 = this->workMove;
  pdVar26 = this->workDual;
  dVar32 = 0.0;
  iVar23 = 0;
  do {
    if (iVar23 < iVar24) {
      pdVar5 = this->workRange;
      lVar25 = (long)iVar24 - (long)iVar23;
      ppVar22 = ppVar3 + iVar23;
      do {
        iVar23 = ppVar22->first;
        dVar34 = ppVar22->second;
        if ((double)piVar4[iVar23] * pdVar26[iVar23] <= dVar27 * dVar34) {
          iVar21 = *__args;
          *__args = iVar21 + 1;
          iVar2 = ppVar3[iVar21].first;
          ppVar3[iVar21].first = ppVar22->first;
          ppVar22->first = iVar2;
          dVar35 = ppVar3[iVar21].second;
          ppVar3[iVar21].second = dVar34;
          ppVar22->second = dVar35;
          dVar32 = dVar32 + dVar34 * pdVar5[iVar23];
        }
        ppVar22 = ppVar22 + 1;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    if (local_38 <= dVar32) break;
    dVar27 = dVar27 * 10.0;
    iVar23 = *__args;
  } while (iVar23 != iVar24);
  pHVar6 = this->workModel;
  uVar10 = rdtsc();
  uVar16 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar12._4_4_ = uVar16;
  auVar12._0_4_ = uVar16;
  auVar12._8_4_ = 0;
  auVar29._0_12_ = auVar12 << 0x20;
  auVar29._12_4_ = 0x45300000;
  (pHVar6->timer).itemTicks[0xd] =
       (((auVar29._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) -
       (pHVar6->timer).itemStart[0xd]) + (pHVar6->timer).itemTicks[0xd];
  uVar10 = rdtsc();
  uVar17 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar30._8_4_ = uVar17;
  auVar30._0_8_ = CONCAT44(uVar16,uVar17) << 0x20;
  auVar30._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xe] =
       (auVar30._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  local_48 = this->workModel->dblOption[2];
  uVar14 = this->workCount;
  this->workCount = 0;
  piVar4 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar19._M_current =
       (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current != piVar4) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
    iVar19._M_current = piVar4;
  }
  dVar27 = this->workTheta;
  local_4c = 0;
  uStack_30 = 0;
  if (iVar19._M_current ==
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->workGroup,iVar19,&local_4c);
  }
  else {
    *iVar19._M_current = 0;
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar19._M_current + 1;
  }
  uVar20 = *__args;
  dVar32 = 1e-12;
  dVar34 = local_48;
  dVar35 = local_38;
  while (dVar27 < 1e+18) {
    if ((int)uVar20 < (int)uVar14) {
      ppVar3 = (this->workData).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar4 = this->workMove;
      pdVar26 = this->workDual;
      pdVar5 = this->workRange;
      lVar25 = (long)(int)uVar14 - (long)(int)uVar20;
      ppVar22 = ppVar3 + (int)uVar20;
      dVar36 = 1e+100;
      do {
        iVar24 = ppVar22->first;
        dVar1 = ppVar22->second;
        dVar33 = (double)piVar4[iVar24] * pdVar26[iVar24];
        if (dVar33 <= dVar27 * dVar1) {
          iVar23 = *__args;
          *__args = iVar23 + 1;
          iVar21 = ppVar3[iVar23].first;
          ppVar3[iVar23].first = ppVar22->first;
          ppVar22->first = iVar21;
          dVar33 = ppVar3[iVar23].second;
          ppVar3[iVar23].second = dVar1;
          ppVar22->second = dVar33;
          dVar32 = dVar32 + dVar1 * pdVar5[iVar24];
        }
        else {
          dVar33 = dVar33 + dVar34;
          if (dVar33 < dVar36 * dVar1) {
            dVar36 = dVar33 / dVar1;
          }
        }
        ppVar22 = ppVar22 + 1;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    else {
      dVar36 = 1e+100;
    }
    iVar19._M_current =
         (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_40 = dVar36;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->workGroup,iVar19,__args);
      uVar20 = *__args;
      dVar34 = local_48;
      dVar35 = local_38;
      dVar27 = local_40;
    }
    else {
      uVar20 = this->workCount;
      *iVar19._M_current = uVar20;
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar19._M_current + 1;
      dVar27 = dVar36;
    }
    if ((dVar35 <= dVar32) || (uVar20 == uVar14)) break;
  }
  ppVar3 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)uVar20 < 1) {
    dVar27 = 0.0;
  }
  else {
    lVar25 = 0;
    dVar32 = 0.0;
    do {
      dVar27 = *(double *)((long)&ppVar3->second + lVar25);
      if (dVar27 <= dVar32) {
        dVar27 = dVar32;
      }
      lVar25 = lVar25 + 0x10;
      dVar32 = dVar27;
    } while ((ulong)uVar20 << 4 != lVar25);
    dVar27 = dVar27 * 0.1;
  }
  piVar7 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar7) >> 2) - 2;
  if ((int)uVar14 < 0) {
    lVar25 = -1;
    lVar18 = -1;
  }
  else {
    dVar32 = 1.0;
    if (dVar27 <= 1.0) {
      dVar32 = dVar27;
    }
    uVar15 = (ulong)uVar14;
    do {
      iVar24 = piVar7[uVar15];
      iVar23 = -1;
      if (iVar24 < piVar7[uVar15 + 1]) {
        lVar25 = (long)piVar7[uVar15 + 1] - (long)iVar24;
        pdVar26 = &ppVar3[iVar24].second;
        dVar27 = 0.0;
        iVar21 = -1;
        do {
          dVar34 = *pdVar26;
          iVar23 = iVar24;
          if (dVar34 <= dVar27) {
            bVar8 = NAN(dVar34);
            bVar9 = dVar27 == dVar34;
            dVar34 = dVar27;
            iVar23 = iVar21;
            if (((bVar9) && (!NAN(dVar27) && !bVar8)) &&
               (iVar23 = iVar24,
               this->workRand[ppVar3[iVar21].first] <=
               this->workRand[((pair<int,_double> *)(pdVar26 + -1))->first])) {
              iVar23 = iVar21;
            }
          }
          pdVar26 = pdVar26 + 2;
          iVar24 = iVar24 + 1;
          lVar25 = lVar25 + -1;
          dVar27 = dVar34;
          iVar21 = iVar23;
        } while (lVar25 != 0);
      }
      if (dVar32 < ppVar3[iVar23].second) goto LAB_0011bbe6;
      bVar8 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar8);
    iVar23 = -1;
    uVar15 = 0xffffffffffffffff;
LAB_0011bbe6:
    lVar18 = (long)iVar23;
    lVar25 = (long)(int)uVar15;
  }
  iVar24 = ppVar3[lVar18].first;
  this->workPivot = iVar24;
  uVar15 = -(ulong)(this->workDelta < 0.0);
  piVar4 = this->workMove;
  dVar32 = (double)piVar4[iVar24];
  dVar27 = (double)(uVar15 & (ulong)-ppVar3[lVar18].second | ~uVar15 & (ulong)ppVar3[lVar18].second)
           * dVar32;
  this->workAlpha = dVar27;
  dVar27 = (double)(-(ulong)(0.0 < dVar32 * this->workDual[iVar24]) &
                   (ulong)(this->workDual[iVar24] / dVar27));
  this->workTheta = dVar27;
  this->workCount = 0;
  if (piVar7[lVar25] < 1) {
    lVar18 = 0;
  }
  else {
    pdVar26 = this->workRange;
    lVar18 = 0;
    ppVar22 = ppVar3;
    do {
      iVar24 = ppVar22->first;
      iVar23 = piVar4[iVar24];
      dVar32 = pdVar26[iVar24];
      lVar18 = lVar18 + 1;
      *__args = (int)lVar18;
      ppVar22->first = iVar24;
      ppVar22->second = (double)iVar23 * dVar32;
      ppVar22 = ppVar22 + 1;
    } while (lVar18 < piVar7[lVar25]);
  }
  if ((dVar27 != 0.0) || (NAN(dVar27))) {
    if ((int)lVar18 != 0) {
      uVar15 = (ulong)(int)lVar18;
      lVar25 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar25 == 0; lVar25 = lVar25 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar3,ppVar3 + uVar15,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar3,ppVar3 + uVar15);
    }
  }
  else {
    *__args = 0;
  }
  pHVar6 = this->workModel;
  uVar10 = rdtsc();
  uVar16 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar13._4_4_ = uVar16;
  auVar13._0_4_ = uVar16;
  auVar13._8_4_ = 0;
  auVar31._0_12_ = auVar13 << 0x20;
  auVar31._12_4_ = 0x45300000;
  (pHVar6->timer).itemTicks[0xe] =
       (((auVar31._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) -
       (pHVar6->timer).itemStart[0xe]) + (pHVar6->timer).itemTicks[0xe];
  return;
}

Assistant:

void HDualRow::choose_final() {
    /**
     * This routine choose the dual entering variable by
     * BFRT and EXPAND. (In sequential)
     *
     * It will
     * (1) reduce the candidates as a small collection
     * (2) choose by BFRT by going over break points
     * (3) choose final by alpha
     * (4) determine final flip variables
     */

    // 1. Reduce by large step BFRT
    workModel->timer.recordStart(HTICK_CHUZC2);
    int fullCount = workCount;
    workCount = 0;
    double totalChange = 0;
    double totalDelta = fabs(workDelta);
    double selectTheta = 10 * workTheta + 1e-7;
    for (;;) {
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double alpha = workData[i].second;
            double tight = workMove[iCol] * workDual[iCol];
            if (alpha * selectTheta >= tight) {
                swap(workData[workCount++], workData[i]);
                totalChange += workRange[iCol] * alpha;
            }
        }
        selectTheta *= 10;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }
    workModel->timer.recordFinish(HTICK_CHUZC2);

    // 2. Choose by small step BFRT
    workModel->timer.recordStart(HTICK_CHUZC3);
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    fullCount = workCount;
    workCount = 0;
    totalChange = 1e-12;
    selectTheta = workTheta;
    workGroup.clear();
    workGroup.push_back(0);
    while (selectTheta < 1e18) {
        double remainTheta = 1e100;
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double value = workData[i].second;
            double dual = workMove[iCol] * workDual[iCol];
            // Tight satisfy
            if (dual <= selectTheta * value) {
                swap(workData[workCount++], workData[i]);
                totalChange += value * (workRange[iCol]);
            } else if (dual + Td < remainTheta * value) {
                remainTheta = (dual + Td) / value;
            }
        }
        workGroup.push_back(workCount);
        selectTheta = remainTheta;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }

    // 3. Choose large alpha
    double finalCompare = 0;
    for (int i = 0; i < workCount; i++)
        finalCompare = max(finalCompare, workData[i].second);
    finalCompare = min(0.1 * finalCompare, 1.0);
    int countGroup = workGroup.size() - 1;
    int breakGroup = -1;
    int breakIndex = -1;
    for (int iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
        double dMaxFinal = 0;
        int iMaxFinal = -1;
        for (int i = workGroup[iGroup]; i < workGroup[iGroup + 1]; i++) {
            if (dMaxFinal < workData[i].second) {
                dMaxFinal = workData[i].second;
                iMaxFinal = i;
            } else if (dMaxFinal == workData[i].second) {
                int jCol = workData[iMaxFinal].first;
                int iCol = workData[i].first;
                if (workRand[iCol] < workRand[jCol]) {
                    iMaxFinal = i;
                }
            }
        }

        if (workData[iMaxFinal].second > finalCompare) {
            breakIndex = iMaxFinal;
            breakGroup = iGroup;
            break;
        }

    }

    int sourceOut = workDelta < 0 ? -1 : 1;
    workPivot = workData[breakIndex].first;
    workAlpha = workData[breakIndex].second * sourceOut * workMove[workPivot];
    if (workDual[workPivot] * workMove[workPivot] > 0)
        workTheta = workDual[workPivot] / workAlpha;
    else
        workTheta = 0;

    // 4. Determine BFRT flip index: flip all
    fullCount = breakIndex;
    workCount = 0;
    for (int i = 0; i < workGroup[breakGroup]; i++) {
        const int iCol = workData[i].first;
        const int move = workMove[iCol];
        workData[workCount++] = make_pair(iCol, move * workRange[iCol]);
    }
    if (workTheta == 0)
        workCount = 0;
    sort(workData.begin(), workData.begin() + workCount);
    workModel->timer.recordFinish(HTICK_CHUZC3);
}